

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

void __thiscall
google::protobuf::UnknownFieldSet::AddFixed64(UnknownFieldSet *this,int number,uint64 value)

{
  pointer *ppUVar1;
  iterator __position;
  UnknownField field;
  UnknownField local_10;
  
  local_10.type_ = 2;
  __position._M_current =
       (this->fields_).
       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_10.number_ = number;
    local_10.data_.varint_ = value;
    std::vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>::
    _M_realloc_insert<google::protobuf::UnknownField_const&>
              ((vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>
                *)this,__position,&local_10);
  }
  else {
    (__position._M_current)->number_ = number;
    (__position._M_current)->type_ = 2;
    ((__position._M_current)->data_).varint_ = value;
    ppUVar1 = &(this->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppUVar1 = *ppUVar1 + 1;
  }
  return;
}

Assistant:

void UnknownFieldSet::AddFixed64(int number, uint64 value) {
  UnknownField field;
  field.number_ = number;
  field.SetType(UnknownField::TYPE_FIXED64);
  field.data_.fixed64_ = value;
  fields_.push_back(field);
}